

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxleastsqsc.hpp
# Opt level: O1

void soplex::initConstVecs<double>
               (SVSetBase<double> *vecset,SVSetBase<double> *facset,SSVectorBase<double> *veclogs,
               SSVectorBase<double> *vecnnzinv,double epsilon)

{
  Item *pIVar1;
  int iVar2;
  int iVar3;
  Nonzero<double> *pNVar4;
  Nonzero<double> *pNVar5;
  long lVar6;
  SVectorBase<double> *this;
  long lVar7;
  int idxmax;
  long lVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  
  lVar6 = (long)(vecset->set).thenum;
  if (0 < lVar6) {
    lVar9 = 0;
    do {
      pIVar1 = (vecset->set).theitem + (vecset->set).thekey[lVar9].idx;
      iVar2 = (pIVar1->data).super_SVectorBase<double>.memused;
      lVar7 = (long)iVar2;
      idxmax = 0;
      dVar11 = 0.0;
      if (0 < lVar7) {
        lVar8 = 0;
        idxmax = 0;
        do {
          dVar10 = ABS(*(double *)
                        ((long)&((pIVar1->data).super_SVectorBase<double>.m_elem)->val + lVar8));
          if (epsilon < dVar10) {
            dVar10 = log2(dVar10);
            dVar11 = dVar11 + dVar10;
            idxmax = idxmax + 1;
          }
          lVar8 = lVar8 + 0x10;
        } while (lVar7 << 4 != lVar8);
      }
      if (idxmax < 1) {
        dVar10 = 1.0;
        dVar11 = 1.0;
      }
      else {
        dVar10 = 1.0 / (double)idxmax;
      }
      iVar3 = (veclogs->super_IdxSet).num;
      (veclogs->super_IdxSet).num = iVar3 + 1;
      (veclogs->super_IdxSet).idx[iVar3] = (int)lVar9;
      (veclogs->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar9] = dVar11;
      iVar3 = (vecnnzinv->super_IdxSet).num;
      (vecnnzinv->super_IdxSet).num = iVar3 + 1;
      (vecnnzinv->super_IdxSet).idx[iVar3] = (int)lVar9;
      (vecnnzinv->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start[lVar9] = dVar10;
      this = SVSetBase<double>::create(facset,idxmax);
      if (0 < iVar2) {
        pNVar4 = (pIVar1->data).super_SVectorBase<double>.m_elem;
        lVar8 = 0;
        do {
          if ((epsilon < ABS(*(double *)((long)&pNVar4->val + lVar8))) &&
             ((dVar10 != 0.0 || (NAN(dVar10))))) {
            iVar2 = this->memused;
            pNVar5 = this->m_elem;
            pNVar5[iVar2].idx = *(int *)((long)&pNVar4->idx + lVar8);
            pNVar5[iVar2].val = dVar10;
            this->memused = iVar2 + 1;
          }
          lVar8 = lVar8 + 0x10;
        } while (lVar7 * 0x10 != lVar8);
      }
      SVectorBase<double>::sort(this);
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar6);
  }
  return;
}

Assistant:

static void initConstVecs(
   const SVSetBase<R>* vecset,
   SVSetBase<R>& facset,
   SSVectorBase<R>& veclogs,
   SSVectorBase<R>& vecnnzinv,
   R epsilon)
{
   assert(vecset != nullptr);

   const int nvec = vecset->num();

   for(int k = 0; k < nvec; ++k)
   {
      R logsum = 0.0;
      int nnz = 0;
      // get kth row or column of LP
      const SVectorBase<R>& lpvec = (*vecset)[k];
      const int size = lpvec.size();

      for(int i = 0; i < size; ++i)
      {
         const R a = lpvec.value(i);

         if(!isZero(a, epsilon))
         {
            logsum += log2(double(spxAbs(a))); // todo spxLog2?
            nnz++;
         }
      }

      R nnzinv;

      if(nnz > 0)
      {
         nnzinv = 1.0 / nnz;
      }
      else
      {
         /* all-0 entries */
         logsum = 1.0;
         nnzinv = 1.0;
      }

      veclogs.add(k, logsum);
      vecnnzinv.add(k, nnzinv);

      /* create new VectorBase<R> for facset */
      SVectorBase<R>& vecnew = (*(facset.create(nnz)));

      for(int i = 0; i < size; ++i)
      {
         if(!isZero(lpvec.value(i), epsilon))
            vecnew.add(lpvec.index(i), nnzinv);
      }

      vecnew.sort();
   }

   assert(veclogs.isSetup());
   assert(vecnnzinv.isSetup());
}